

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StructuredAssignmentPatternExpression::forStruct
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange range;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  string_view arg;
  string_view arg_00;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  SourceRange assignmentRange_01;
  string_view name_00;
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  Symbol **__x;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  SyntaxNode *pSVar5;
  IdentifierNameSyntax *pIVar6;
  StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>
  *pSVar7;
  equal_to<const_slang::ast::Symbol_*> *this;
  pointer ppVar8;
  raw_key_type *ppSVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SourceLocation in_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  long in_RSI;
  FieldSymbol *in_RDI;
  SourceRange SVar10;
  string_view sVar11;
  SourceRange SVar12;
  SourceRange SVar13;
  StructuredAssignmentPatternExpression *result;
  Expression *expr_3;
  Type *fieldType;
  iterator it_1;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end2_1;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin2_1;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *__range2_1;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  Expression *expr_2;
  Type *typeKey;
  Diagnostic *diag_1;
  Expression *expr_1;
  Symbol *found;
  Diagnostic *diag;
  type_conflict *inserted;
  type *it;
  Expression *expr;
  Symbol *member;
  string_view name;
  Token nameToken;
  AssignmentPatternItemSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *__range2;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL> memberSetters;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  memberMap;
  Expression *defaultSetter;
  bool bad;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>,_const_slang::ast::Symbol_*&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements_1;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_2;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  Type *in_stack_fffffffffffff4b8;
  Expression *expr_00;
  ASTContext *in_stack_fffffffffffff4c0;
  Compilation *compilation;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>
  *in_stack_fffffffffffff4c8;
  Compilation *in_stack_fffffffffffff4d0;
  Compilation *in_stack_fffffffffffff4d8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff4e0;
  SourceLocation in_stack_fffffffffffff4e8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *in_stack_fffffffffffff4f0;
  Diagnostic *in_stack_fffffffffffff500;
  Type *in_stack_fffffffffffff508;
  Diagnostic *in_stack_fffffffffffff510;
  Scope *in_stack_fffffffffffff518;
  size_t in_stack_fffffffffffff520;
  char *in_stack_fffffffffffff528;
  Expression **in_stack_fffffffffffff530;
  undefined7 in_stack_fffffffffffff538;
  undefined1 in_stack_fffffffffffff53f;
  try_emplace_args_t *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  *in_stack_fffffffffffff550;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *in_stack_fffffffffffff558;
  ASTContext *in_stack_fffffffffffff560;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *in_stack_fffffffffffff568;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff578;
  SourceLocation in_stack_fffffffffffff580;
  SourceLocation in_stack_fffffffffffff588;
  SourceLocation in_stack_fffffffffffff5a0;
  SourceRange *in_stack_fffffffffffff5a8;
  SourceLocation in_stack_fffffffffffff7b8;
  SourceLocation in_stack_fffffffffffff7c0;
  ExpressionSyntax *in_stack_fffffffffffff7c8;
  Type *in_stack_fffffffffffff7d0;
  Expression *in_stack_fffffffffffff820;
  FieldSymbol *in_stack_fffffffffffff828;
  Type *in_stack_fffffffffffff830;
  SourceLocation in_stack_fffffffffffff838;
  SourceLocation in_stack_fffffffffffff840;
  SourceLocation in_stack_fffffffffffff848;
  AssignmentPatternItemSyntax *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  Expression local_760;
  undefined8 local_730;
  StructuredAssignmentPatternExpression *local_720;
  Type *local_718;
  ASTContext *pAStack_710;
  Expression *local_6f8;
  Type *local_6f0;
  iterator local_6e8;
  FieldSymbol *local_6d8;
  ASTContext *local_6d0;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *local_6c8;
  FieldSymbol *local_6c0;
  Symbol *local_6b8;
  Symbol *local_6b0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_6a8;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *local_698;
  SmallVectorBase<const_slang::ast::Expression_*> local_690 [2];
  SourceRange local_650;
  undefined4 local_63c;
  SourceRange local_638;
  undefined4 local_624;
  Expression *local_620;
  Type *local_618;
  not_null<const_slang::ast::Type_*> local_610;
  not_null<const_slang::ast::Expression_*> local_608;
  bitmask<slang::ast::ASTFlags> local_600 [3];
  Expression *local_5e8;
  Type *local_5e0;
  string_view local_5d8;
  SourceRange local_5c0;
  undefined4 local_5ac;
  Diagnostic *local_5a8;
  Expression *local_5a0;
  Type *local_598;
  not_null<const_slang::ast::Type_*> local_590;
  not_null<const_slang::ast::Expression_*> local_588;
  bitmask<slang::ast::ASTFlags> local_580;
  SourceRange local_578;
  Expression *local_568;
  bitmask<slang::ast::LookupFlags> local_55c;
  string_view local_558;
  Symbol *local_548;
  Expression *local_540;
  not_null<const_slang::ast::Symbol_*> local_538;
  not_null<const_slang::ast::Expression_*> local_530;
  SourceLocation local_528;
  SourceLocation SStack_520;
  undefined4 local_50c;
  string_view local_508;
  SourceRange local_4f8;
  undefined4 local_4e4;
  Diagnostic *local_4e0;
  type_conflict *local_4d8;
  type *local_4d0;
  Expression *local_4c8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_4c0;
  bitmask<slang::ast::ASTFlags> local_4a8;
  SourceRange local_4a0;
  Expression *local_490;
  string_view local_488;
  Symbol *local_470;
  string_view local_468;
  undefined8 local_458;
  Info *pIStack_450;
  bitmask<slang::ast::ASTFlags> local_448;
  SourceRange local_440;
  undefined4 local_42c;
  AssignmentPatternItemSyntax *local_428;
  const_iterator local_420;
  const_iterator local_400;
  long local_3f0;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> local_3e8 [2];
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter> local_390 [5];
  undefined1 local_2b0 [16];
  size_t local_2a0;
  ulong local_288;
  ulong local_280;
  Expression *local_278;
  byte local_269;
  SourceLocation local_258;
  long local_250;
  FieldSymbol *local_248;
  StructuredAssignmentPatternExpression *local_240;
  Type *local_238;
  Symbol **local_230;
  undefined1 *local_228;
  SourceLocation local_220;
  undefined1 *local_218;
  ASTContext *local_210;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  *local_208;
  undefined1 local_1f9;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>,_const_slang::ast::Symbol_*&,_void>
  local_1f8;
  Type *local_1f0;
  Symbol **local_1e8;
  undefined1 *local_1e0;
  bool local_1d1 [25];
  iterator local_1b8;
  bool local_1a1 [25];
  iterator local_188;
  bool local_171;
  iterator local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
  local_160;
  size_t local_148;
  size_t local_140;
  Symbol **local_138;
  Type *local_130;
  Symbol **local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  size_t local_d0;
  size_t local_c8;
  Symbol **local_c0;
  undefined1 *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
  local_b0;
  SourceLocation local_98;
  undefined1 *local_90;
  iterator local_88;
  size_t local_78;
  SourceLocation local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  SourceRange *local_18;
  SourceLocation local_10;
  undefined1 *local_8;
  
  compilation = (Compilation *)&stack0x00000008;
  local_269 = 0;
  local_278 = (Expression *)0x0;
  local_258 = in_RDX;
  local_250 = in_RSI;
  local_248 = in_RDI;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap((SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
              *)in_stack_fffffffffffff4d0);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL> *)
             0xedc58d);
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>::SmallVector
            ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> *)
             0xedc59a);
  local_3f0 = local_250 + 0x28;
  local_400 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0xedc5bb
                        );
  local_420 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)0xedc5fa
                        );
  SVar10.endLoc = in_stack_fffffffffffff838;
  SVar10.startLoc = in_stack_fffffffffffff840;
  SVar12.endLoc = in_stack_fffffffffffff7b8;
  SVar12.startLoc = in_stack_fffffffffffff7c0;
  while( true ) {
    uVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffff4c0,
                       (iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*> *)
                       in_stack_fffffffffffff4b8);
    if (((uVar1 ^ 0xff) & 1) == 0) break;
    in_stack_fffffffffffff860 =
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                      *)0xedc669);
    local_428 = in_stack_fffffffffffff860;
    pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc694);
    if ((pEVar4->super_SyntaxNode).kind == DefaultPatternKeyExpression) {
      if (local_278 != (Expression *)0x0) {
        local_42c = 0xf0007;
        in_stack_fffffffffffff848 = local_258;
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc6ed);
        SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff510);
        sourceRange_00.endLoc = in_stack_fffffffffffff4e8;
        sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
        local_440 = SVar10;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4d8,
                            SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),sourceRange_00);
        local_269 = 1;
      }
      in_stack_fffffffffffff828 = local_248;
      in_stack_fffffffffffff830 =
           (Type *)not_null<slang::syntax::ExpressionSyntax_*>::operator*
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc7a0);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_448,None);
      in_stack_fffffffffffff820 =
           Expression::selfDetermined
                     (in_stack_fffffffffffff4d8,(ExpressionSyntax *)in_stack_fffffffffffff4d0,
                      (ASTContext *)in_stack_fffffffffffff4c8,in_stack_fffffffffffff4e0);
      local_278 = in_stack_fffffffffffff820;
      bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff4c0);
      local_269 = (local_269 & 1) != 0 || bVar2;
    }
    else {
      pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc85f);
      if ((pEVar4->super_SyntaxNode).kind == IdentifierName) {
        pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc88e)->
                  super_SyntaxNode;
        pIVar6 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar5);
        local_458._0_2_ = (pIVar6->identifier).kind;
        local_458._2_1_ = (pIVar6->identifier).field_0x2;
        local_458._3_1_ = (pIVar6->identifier).numFlags;
        local_458._4_4_ = (pIVar6->identifier).rawLen;
        pIStack_450 = (pIVar6->identifier).info;
        sVar11 = parsing::Token::valueText((Token *)in_stack_fffffffffffff4d0);
        local_468 = sVar11;
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_468);
        if (bVar2) {
          local_269 = 1;
        }
        else {
          sVar11._M_str = in_stack_fffffffffffff528;
          sVar11._M_len = in_stack_fffffffffffff520;
          local_488 = local_468;
          local_470 = Scope::find(in_stack_fffffffffffff518,sVar11);
          if (local_470 == (Symbol *)0x0) {
            not_null<const_slang::ast::Scope_*>::operator*
                      ((not_null<const_slang::ast::Scope_*> *)0xedd20f);
            local_558 = local_468;
            bitmask<slang::ast::LookupFlags>::bitmask(&local_55c,Type);
            name_00._M_str = (char *)in_stack_fffffffffffff7d0;
            name_00._M_len = (size_t)in_stack_fffffffffffff7c8;
            local_548 = Lookup::unqualified((Scope *)SVar12.endLoc,name_00,
                                            (bitmask<slang::ast::LookupFlags>)SVar12.startLoc._4_4_)
            ;
            if (local_548 != (Symbol *)0x0) {
              bVar2 = Symbol::isType((Symbol *)0xedd295);
              if (bVar2) {
                Symbol::as<slang::ast::Type>((Symbol *)0xedd2bb);
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd2d6);
                SVar13 = parsing::Token::range((Token *)in_stack_fffffffffffff4e0.m_bits);
                local_578 = SVar13;
                bitmask<slang::ast::ASTFlags>::bitmask(&local_580,None);
                assignmentRange_00.endLoc = in_stack_fffffffffffff588;
                assignmentRange_00.startLoc = in_stack_fffffffffffff580;
                local_568 = Expression::bindRValue
                                      ((Type *)CONCAT17(in_stack_fffffffffffff577,
                                                        in_stack_fffffffffffff570),
                                       (ExpressionSyntax *)in_stack_fffffffffffff568,
                                       assignmentRange_00,in_stack_fffffffffffff560,
                                       in_stack_fffffffffffff578);
                bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff4c0);
                local_269 = local_269 & 1 | bVar2;
                local_598 = Symbol::as<slang::ast::Type>((Symbol *)0xedd3db);
                not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                          (&local_590,&local_598);
                local_5a0 = local_568;
                not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
                          (&local_588,&local_5a0);
                SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
                emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                          (&in_stack_fffffffffffff4c8->
                            super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                           ,(TypeSetter *)in_stack_fffffffffffff4c0);
                goto LAB_00edd8e1;
              }
            }
            local_5ac = 0x3a000a;
            not_null<slang::syntax::ExpressionSyntax_*>::operator->
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd47b);
            SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff510)
            ;
            sourceRange_02.endLoc = in_stack_fffffffffffff4e8;
            sourceRange_02.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
            local_5c0 = SVar13;
            local_5a8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4d8,
                                            SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),
                                            sourceRange_02);
            arg_00._M_str = (char *)in_stack_fffffffffffff510;
            arg_00._M_len = (size_t)in_stack_fffffffffffff508;
            local_5d8 = local_468;
            Diagnostic::operator<<(in_stack_fffffffffffff500,arg_00);
            ast::operator<<(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
            local_269 = 1;
          }
          else {
            Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xedc985);
            in_stack_fffffffffffff7d0 = ValueSymbol::getType((ValueSymbol *)0xedc99c);
            in_stack_fffffffffffff7c8 =
                 not_null<slang::syntax::ExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedc9b7);
            SVar12 = parsing::Token::range((Token *)in_stack_fffffffffffff4e0.m_bits);
            local_4a0 = SVar12;
            bitmask<slang::ast::ASTFlags>::bitmask(&local_4a8,None);
            assignmentRange.endLoc = in_stack_fffffffffffff588;
            assignmentRange.startLoc = in_stack_fffffffffffff580;
            local_490 = Expression::bindRValue
                                  ((Type *)CONCAT17(in_stack_fffffffffffff577,
                                                    in_stack_fffffffffffff570),
                                   (ExpressionSyntax *)in_stack_fffffffffffff568,assignmentRange,
                                   in_stack_fffffffffffff560,in_stack_fffffffffffff578);
            bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff4c0);
            local_269 = local_269 & 1 | bVar2;
            local_4c8 = local_490;
            local_230 = &local_470;
            local_238 = (Type *)&local_4c8;
            local_228 = local_2b0;
            local_1f0 = local_238;
            local_1e8 = local_230;
            local_1e0 = local_2b0;
            pSVar7 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                     ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                           *)0xedcb24);
            boost::unordered::detail::foa::
            alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>,_const_slang::ast::Symbol_*&,_void>
            ::alloc_cted_or_fwded_key_type(&local_1f8,pSVar7,local_1e8);
            local_128 = boost::unordered::detail::foa::
                        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>,_const_slang::ast::Symbol_*&,_void>
                        ::move_or_fwd(&local_1f8);
            local_120 = &local_1f9;
            local_130 = local_1f0;
            local_118 = local_2b0;
            local_138 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                        ::key_from<slang::ast::Symbol_const*,slang::ast::Expression_const*>
                                  (local_128,local_1f0);
            local_140 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                        ::hash_for<slang::ast::Symbol_const*>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                    *)in_stack_fffffffffffff4c0,(Symbol **)in_stack_fffffffffffff4b8
                                  );
            local_148 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                        *)in_stack_fffffffffffff4c0,
                                       (size_t)in_stack_fffffffffffff4b8);
            local_c0 = local_138;
            local_d0 = local_140;
            local_c8 = local_148;
            local_b8 = local_2b0;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_e0,local_148);
            do {
              local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
              local_f0 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                   *)0xedcca2);
              local_f0 = local_f0 + local_e8;
              local_f4 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::match
                                   ((group15<boost::unordered::detail::foa::plain_integral> *)
                                    in_stack_fffffffffffff4c8,(size_t)in_stack_fffffffffffff4c0);
              if (local_f4 != 0) {
                local_100 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                            ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                        *)0xedcd04);
                local_108 = local_100 + local_e8 * 0xf;
                do {
                  local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  this = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                                 *)0xedcd57);
                  __x = local_c0;
                  ppSVar9 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                            ::
                            key_from<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>>
                                      ((pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>
                                        *)0xedcd8a);
                  bVar2 = std::equal_to<const_slang::ast::Symbol_*>::operator()(this,__x,ppSVar9);
                  if (bVar2) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
                    ::table_locator(&local_160,local_f0,local_10c,local_108 + local_10c);
                    goto LAB_00edcea6;
                  }
                  local_f4 = local_f4 - 1 & local_f4;
                } while (local_f4 != 0);
              }
              bVar2 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8);
              if (bVar2) {
                memset(&local_160,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
                ::table_locator(&local_160);
                goto LAB_00edcea6;
              }
              bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_e0,local_2a0);
            } while (bVar2);
            memset(&local_160,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_160);
LAB_00edcea6:
            bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                              ((table_locator *)&local_160);
            if (bVar2) {
              local_170 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                          ::make_iterator((locator *)0xedcec8);
              local_171 = false;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4c0,&local_170,&local_171);
            }
            else if (local_280 < local_288) {
              in_stack_fffffffffffff4b8 = local_130;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                        (in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8,
                         in_stack_fffffffffffff4e0.m_bits,
                         (try_emplace_args_t *)in_stack_fffffffffffff4d8,
                         (Symbol **)in_stack_fffffffffffff4d0,
                         (Expression **)in_stack_fffffffffffff500);
              local_188 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                          ::make_iterator((locator *)0xedcf6a);
              local_1a1[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4c0,&local_188,local_1a1);
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                        (in_stack_fffffffffffff550,
                         CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
                         in_stack_fffffffffffff540,
                         (Symbol **)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),
                         in_stack_fffffffffffff530);
              local_1b8 = boost::unordered::detail::foa::
                          table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                          ::make_iterator((locator *)0xedcfe5);
              local_1d1[0] = true;
              std::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
              ::
              pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                        (&local_4c0,&local_1b8,local_1d1);
            }
            local_4d0 = std::
                        get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                    *)0xedd02d);
            local_4d8 = std::
                        get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                                    *)0xedd042);
            if ((*local_4d8 & 1U) == 0) {
              local_4e4 = 0x100007;
              not_null<slang::syntax::ExpressionSyntax_*>::operator->
                        ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd087);
              SVar13 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)in_stack_fffffffffffff510);
              sourceRange_01.endLoc = in_stack_fffffffffffff4e8;
              sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
              local_4f8 = SVar13;
              local_4e0 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4d8,
                                              SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),
                                              sourceRange_01);
              arg._M_str = (char *)in_stack_fffffffffffff510;
              arg._M_len = (size_t)in_stack_fffffffffffff508;
              local_508 = local_468;
              Diagnostic::operator<<(in_stack_fffffffffffff500,arg);
              local_50c = 0xa0001;
              ppVar8 = boost::unordered::detail::foa::
                       table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                       ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                     *)in_stack_fffffffffffff4c0);
              local_528 = (ppVar8->second->sourceRange).startLoc;
              SStack_520 = (ppVar8->second->sourceRange).endLoc;
              range.endLoc = in_stack_fffffffffffff4e8;
              range.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
              Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff4d8,
                                  SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),range);
              local_269 = 1;
            }
            else {
              not_null<const_slang::ast::Symbol_*>::not_null<const_slang::ast::Symbol_*&>
                        (&local_538,&local_470);
              local_540 = local_490;
              not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
                        (&local_530,&local_540);
              SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::
              emplace_back<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                        ((SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                          *)in_stack_fffffffffffff4c8,(MemberSetter *)in_stack_fffffffffffff4c0);
            }
          }
        }
      }
      else {
        pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd568);
        bVar2 = slang::syntax::DataTypeSyntax::isKind((pEVar4->super_SyntaxNode).kind);
        if (bVar2) {
          pSVar5 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                              ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd5bb)->
                    super_SyntaxNode;
          slang::syntax::SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar5);
          local_5e0 = Compilation::getType
                                (in_stack_fffffffffffff4d0,
                                 (DataTypeSyntax *)in_stack_fffffffffffff4c8,
                                 in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
          bVar2 = Type::isSimpleType(local_5e0);
          if (bVar2) {
            not_null<slang::syntax::ExpressionSyntax_*>::operator*
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd65e);
            SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffff4c0);
            bitmask<slang::ast::ASTFlags>::bitmask(local_600,None);
            assignmentRange_01.endLoc = in_stack_fffffffffffff588;
            assignmentRange_01.startLoc = in_stack_fffffffffffff580;
            local_5e8 = Expression::bindRValue
                                  ((Type *)CONCAT17(in_stack_fffffffffffff577,
                                                    in_stack_fffffffffffff570),
                                   (ExpressionSyntax *)in_stack_fffffffffffff568,assignmentRange_01,
                                   in_stack_fffffffffffff560,in_stack_fffffffffffff578);
            local_618 = local_5e0;
            not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                      (&local_610,&local_618);
            local_620 = local_5e8;
            not_null<const_slang::ast::Expression_*>::not_null<const_slang::ast::Expression_*>
                      (&local_608,&local_620);
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      (&in_stack_fffffffffffff4c8->
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                       ,(TypeSetter *)in_stack_fffffffffffff4c0);
            bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff4c0);
            local_269 = (local_269 & 1) != 0 || bVar2;
          }
          else {
            local_624 = 0x120007;
            not_null<slang::syntax::ExpressionSyntax_*>::operator->
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd7bc);
            SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff510)
            ;
            sourceRange_03.endLoc = in_stack_fffffffffffff4e8;
            sourceRange_03.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
            local_638 = SVar13;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4d8,
                                SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),sourceRange_03);
            local_269 = 1;
          }
        }
        else {
          local_63c = 0x120007;
          not_null<slang::syntax::ExpressionSyntax_*>::operator->
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0xedd864);
          SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff510);
          sourceRange_04.endLoc = in_stack_fffffffffffff4e8;
          sourceRange_04.startLoc = (SourceLocation)in_stack_fffffffffffff4e0.m_bits;
          local_650 = SVar13;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff4d8,
                              SUB84((ulong)in_stack_fffffffffffff4f0 >> 0x20,0),sourceRange_04);
          local_269 = 1;
        }
      }
    }
LAB_00edd8e1:
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>,_false>
                *)in_stack_fffffffffffff4c0);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xedd902);
  local_6a8 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)in_stack_fffffffffffff4d0);
  local_698 = &local_6a8;
  local_6b0 = (Symbol *)
              std::ranges::
              subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
              ::begin(local_698);
  local_6b8 = (Symbol *)
              std::ranges::
              subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
              ::end(local_698);
  do {
    bVar2 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                      ((self_type *)in_stack_fffffffffffff4c0,
                       (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                       in_stack_fffffffffffff4b8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      iVar3 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::copy
                        (local_390,(EVP_PKEY_CTX *)local_248,src);
      local_730 = CONCAT44(extraout_var,iVar3);
      local_760.sourceRange.startLoc._0_4_ =
           SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                     (local_3e8,(EVP_PKEY_CTX *)local_248,src_00);
      local_760.sourceRange.startLoc._4_4_ = extraout_var_00;
      std::
      span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
      ::span((span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
              *)0xede072);
      local_760.kind =
           SmallVectorBase<const_slang::ast::Expression_*>::copy
                     (local_690,(EVP_PKEY_CTX *)local_248,src_01);
      local_760._4_4_ = extraout_var_01;
      expr_00 = &local_760;
      local_720 = BumpAllocator::
                  emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                            ((BumpAllocator *)in_stack_fffffffffffff580,
                             (Type *)in_stack_fffffffffffff578.m_bits,
                             (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                              *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                             in_stack_fffffffffffff568,
                             (span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                              *)in_stack_fffffffffffff560,(Expression **)in_stack_fffffffffffff558,
                             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                             in_stack_fffffffffffff5a0,in_stack_fffffffffffff5a8);
      local_240 = local_720;
      if ((local_269 & 1) != 0) {
        local_240 = (StructuredAssignmentPatternExpression *)
                    Expression::badExpr(compilation,expr_00);
      }
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xede172);
      SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>::~SmallVector
                ((SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> *)
                 0xede17f);
      SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL>::
      ~SmallVector((SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL>
                    *)0xede18c);
      SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
      ::~SmallMap((SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   *)0xede199);
      return (Expression *)local_240;
    }
    local_6d8 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                             *)0xedd9dc);
    local_220 = (SourceLocation)&local_6d8;
    local_6c0 = local_6d8;
    local_218 = local_2b0;
    local_98 = local_220;
    local_90 = local_2b0;
    local_70 = local_220;
    local_68 = local_2b0;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
               ::hash_for<slang::ast::Symbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                           *)in_stack_fffffffffffff4c0,(Symbol **)in_stack_fffffffffffff4b8);
    in_stack_fffffffffffff5a0 = local_70;
    in_stack_fffffffffffff5a8 =
         (SourceRange *)
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
         ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8);
    local_20 = local_78;
    local_18 = in_stack_fffffffffffff5a8;
    local_10 = in_stack_fffffffffffff5a0;
    local_8 = local_2b0;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_30,(size_t)in_stack_fffffffffffff5a8);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                           *)0xeddb57);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff4c8,(size_t)in_stack_fffffffffffff4c0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                               *)0xeddbb9);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffff578.m_bits =
               (underlying_type)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                       *)0xeddc0c);
          in_stack_fffffffffffff580 = local_10;
          ppSVar9 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                    ::
                    key_from<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>>
                              ((pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>
                                *)0xeddc3f);
          bVar2 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            ((equal_to<const_slang::ast::Symbol_*> *)
                             in_stack_fffffffffffff578.m_bits,(Symbol **)in_stack_fffffffffffff580,
                             ppSVar9);
          if (bVar2) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_00eddd5b;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      in_stack_fffffffffffff577 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8);
      if ((bool)in_stack_fffffffffffff577) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
        ::table_locator(&local_b0);
        goto LAB_00eddd5b;
      }
      bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,local_2a0);
    } while (bVar2);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>_>
    ::table_locator(&local_b0);
LAB_00eddd5b:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
               ::make_iterator((locator *)0xeddd6a);
    local_210 = (ASTContext *)local_88.pc_;
    local_208 = (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                 *)local_88.p_;
    local_6d0 = (ASTContext *)local_88.pc_;
    local_6c8 = (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                 *)local_88.p_;
    in_stack_fffffffffffff558 =
         (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          *)local_88.p_;
    in_stack_fffffffffffff560 = (ASTContext *)local_88.pc_;
    in_stack_fffffffffffff568 =
         (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          *)local_88.p_;
    local_6e8 = boost::unordered::
                unordered_flat_map<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                ::end((unordered_flat_map<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                       *)0xedde07);
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff4c0,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)in_stack_fffffffffffff4b8);
    if (bVar2) {
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffff4c0);
      SmallVectorBase<const_slang::ast::Expression_*>::push_back
                ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff4c0,
                 (Expression **)in_stack_fffffffffffff4b8);
    }
    else {
      local_6f0 = ValueSymbol::getType((ValueSymbol *)0xedde9d);
      bVar2 = Type::isError((Type *)0xeddec4);
      if (!bVar2) {
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&(local_6c0->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
        if (!bVar2) {
          std::
          span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          ::
          span<slang::SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL>_&>
                    ((span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                      *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
          SVar13.endLoc = in_stack_fffffffffffff848;
          SVar13.startLoc = SVar10.startLoc;
          typeSetters_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff868;
          typeSetters_00._M_ptr = (pointer)in_stack_fffffffffffff860;
          typeSetters_00._M_extent._M_extent_value._7_1_ = uVar1;
          in_stack_fffffffffffff4b8 = local_718;
          in_stack_fffffffffffff4c0 = pAStack_710;
          local_6f8 = matchElementValue((ASTContext *)SVar10.endLoc,in_stack_fffffffffffff830,
                                        in_stack_fffffffffffff828,SVar13,typeSetters_00,
                                        in_stack_fffffffffffff820);
          if (local_6f8 == (Expression *)0x0) {
            local_269 = 1;
          }
          else {
            SmallVectorBase<const_slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffff4c0,
                       (Expression **)in_stack_fffffffffffff4b8);
          }
          goto LAB_00eddfc9;
        }
      }
      local_269 = 1;
    }
LAB_00eddfc9:
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
    operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                *)in_stack_fffffffffffff4c0);
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forStruct(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<const Symbol*, const Expression*, 8> memberMap;
    SmallVector<MemberSetter, 4> memberSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
        }
        else if (item->key->kind == SyntaxKind::IdentifierName) {
            auto nameToken = item->key->as<IdentifierNameSyntax>().identifier;
            auto name = nameToken.valueText();
            if (name.empty()) {
                bad = true;
                continue;
            }

            const Symbol* member = structScope.find(name);
            if (member) {
                auto& expr = bindRValue(member->as<FieldSymbol>().getType(), *item->expr,
                                        nameToken.range(), context);
                bad |= expr.bad();

                auto [it, inserted] = memberMap.emplace(member, &expr);
                if (!inserted) {
                    auto& diag = context.addDiag(diag::AssignmentPatternKeyDupName,
                                                 item->key->sourceRange());
                    diag << name;
                    diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
                    bad = true;
                    continue;
                }

                memberSetters.emplace_back(MemberSetter{member, &expr});
            }
            else {
                auto found = Lookup::unqualified(*context.scope, name, LookupFlags::Type);
                if (found && found->isType()) {
                    auto& expr = bindRValue(found->as<Type>(), *item->expr, nameToken.range(),
                                            context);
                    bad |= expr.bad();

                    typeSetters.emplace_back(TypeSetter{&found->as<Type>(), &expr});
                }
                else {
                    auto& diag = context.addDiag(diag::UnknownMember, item->key->sourceRange());
                    diag << name;
                    diag << type;
                    bad = true;
                }
            }
        }
        else if (DataTypeSyntax::isKind(item->key->kind)) {
            const Type& typeKey = comp.getType(item->key->as<DataTypeSyntax>(), context);
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
            bad = true;
        }
    }

    SmallVector<const Expression*> elements;
    for (auto& field : structScope.membersOfType<FieldSymbol>()) {
        // If we already have a setter for this field we don't have to do anything else.
        if (auto it = memberMap.find(&field); it != memberMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        const Type& fieldType = field.getType();
        if (fieldType.isError() || field.name.empty()) {
            bad = true;
            continue;
        }

        auto expr = matchElementValue(context, fieldType, &field, sourceRange, typeSetters,
                                      defaultSetter);
        if (!expr) {
            bad = true;
            continue;
        }

        elements.push_back(expr);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, memberSetters.copy(comp), typeSetters.copy(comp), std::span<const IndexSetter>{},
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}